

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

SchemaAttDef * __thiscall
xercesc_4_0::TraverseSchema::traverseAnyAttribute(TraverseSchema *this,DOMElement *elem)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  DOMElement *pDVar4;
  XSAnnotation *annotation;
  XMLCh *pXVar5;
  XMLCh *str1;
  undefined4 extraout_var;
  DatatypeValidator *pDVar6;
  SchemaAttDef *this_00;
  int uriId;
  AttTypes type;
  uint local_a8;
  DefAttTypes local_a4;
  ValueVectorOf<unsigned_int> namespaceList;
  NamespaceScopeManager nsMgr;
  XMLStringTokenizer tokenizer;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,3,this,false,this->fNonXSAttList);
  pDVar4 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar4 = checkContent(this,elem,pDVar4,true,true);
  if (pDVar4 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x54);
  }
  annotation = this->fAnnotation;
  if ((annotation == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
    if (this->fNonXSAttList->fCurCount == 0) {
      annotation = (XSAnnotation *)0x0;
    }
    else {
      annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = annotation;
    }
  }
  pXVar5 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_PROCESSCONTENTS,UnKnown);
  str1 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAMESPACE,UnKnown);
  local_a4 = ProcessContents_Strict;
  if (((pXVar5 != (XMLCh *)0x0) && (*pXVar5 != L'\0')) &&
     (bVar1 = XMLString::equals(pXVar5,(XMLCh *)SchemaSymbols::fgATTVAL_STRICT), !bVar1)) {
    bVar1 = XMLString::equals(pXVar5,(XMLCh *)SchemaSymbols::fgATTVAL_SKIP);
    if (bVar1) {
      local_a4 = ProcessContents_Skip;
    }
    else {
      bVar1 = XMLString::equals(pXVar5,L"lax");
      local_a4 = (uint)bVar1 ^ ProcessContents_Strict;
    }
  }
  uriId = this->fEmptyNamespaceURI;
  namespaceList.fMemoryManager = this->fGrammarPoolMemoryManager;
  namespaceList.fCallDestructor = false;
  namespaceList.fCurCount = 0;
  namespaceList.fMaxCount = 8;
  namespaceList.fElemList = (uint *)0x0;
  iVar2 = (*(namespaceList.fMemoryManager)->_vptr_MemoryManager[3])();
  namespaceList.fElemList = (uint *)CONCAT44(extraout_var,iVar2);
  memset(namespaceList.fElemList,0,namespaceList.fMaxCount << 2);
  type = Any_Any;
  if (((str1 != (XMLCh *)0x0) && (*str1 != L'\0')) &&
     (bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDANY), !bVar1)) {
    bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
    if (bVar1) {
      uriId = this->fTargetNSURI;
      type = Any_Other;
    }
    else {
      XMLStringTokenizer::XMLStringTokenizer(&tokenizer,str1,this->fGrammarPoolMemoryManager);
      pDVar6 = DatatypeValidatorFactory::getDatatypeValidator
                         (this->fDatatypeRegistry,(XMLCh *)SchemaSymbols::fgDT_ANYURI);
      while (bVar1 = XMLStringTokenizer::hasMoreTokens(&tokenizer), bVar1) {
        pXVar5 = XMLStringTokenizer::nextToken(&tokenizer);
        bVar1 = XMLString::equals(pXVar5,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDLOCAL);
        if (bVar1) {
          uVar3 = this->fEmptyNamespaceURI;
        }
        else {
          bVar1 = XMLString::equals(pXVar5,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDTRAGETNAMESPACE)
          ;
          if (bVar1) {
            uVar3 = this->fTargetNSURI;
          }
          else {
            (*(pDVar6->super_XSerializable)._vptr_XSerializable[8])
                      (pDVar6,pXVar5,this->fSchemaInfo->fValidationContext,this->fMemoryManager);
            uVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                              (this->fURIStringPool,pXVar5);
          }
        }
        local_a8 = uVar3;
        bVar1 = ValueVectorOf<unsigned_int>::containsElement(&namespaceList,&local_a8,0);
        if (!bVar1) {
          local_a8 = uVar3;
          ValueVectorOf<unsigned_int>::addElement(&namespaceList,&local_a8);
        }
      }
      uriId = this->fEmptyNamespaceURI;
      XMLStringTokenizer::~XMLStringTokenizer(&tokenizer);
      type = Any_List;
    }
  }
  this_00 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
  SchemaAttDef::SchemaAttDef(this_00,L"",L"",uriId,type,local_a4,this->fGrammarPoolMemoryManager);
  if (annotation != (XSAnnotation *)0x0) {
    SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_00,annotation);
  }
  if (namespaceList.fCurCount != 0) {
    SchemaAttDef::setNamespaceList(this_00,&namespaceList);
  }
  ValueVectorOf<unsigned_int>::~ValueVectorOf(&namespaceList);
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return this_00;
}

Assistant:

SchemaAttDef* TraverseSchema::traverseAnyAttribute(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_AnyAttribute, this, false, fNonXSAttList
    );

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeContentError);
    }
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    // ------------------------------------------------------------------
    // Get attributes
    // ------------------------------------------------------------------
    const XMLCh* const processContents = getElementAttValue(elem, SchemaSymbols::fgATT_PROCESSCONTENTS);
    const XMLCh* const nameSpace = getElementAttValue(elem, SchemaSymbols::fgATT_NAMESPACE);

    // ------------------------------------------------------------------
    // Set default att type based on 'processContents' value
    // ------------------------------------------------------------------
    XMLAttDef::DefAttTypes attDefType = XMLAttDef::ProcessContents_Strict;

    if ((!processContents || !*processContents)
        || XMLString::equals(processContents, SchemaSymbols::fgATTVAL_STRICT)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_SKIP)) {
        attDefType = XMLAttDef::ProcessContents_Skip;
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_LAX)) {
        attDefType = XMLAttDef::ProcessContents_Lax;
    }

    // ------------------------------------------------------------------
    // Process 'namespace' attribute
    // ------------------------------------------------------------------
    int uriIndex = fEmptyNamespaceURI;
    XMLAttDef::AttTypes attType = XMLAttDef::Any_Any;
    ValueVectorOf<unsigned int> namespaceList(8, fGrammarPoolMemoryManager);

    if ((!nameSpace || !*nameSpace)
        || XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDANY)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDOTHER)) {

        attType = XMLAttDef::Any_Other;
        uriIndex = fTargetNSURI;
    }
    else {

        XMLStringTokenizer tokenizer(nameSpace, fGrammarPoolMemoryManager);
        DatatypeValidator* anyURIDV = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYURI);

        attType = XMLAttDef::Any_List;

        while (tokenizer.hasMoreTokens()) {

            const XMLCh* token = tokenizer.nextToken();

            if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDLOCAL)) {
                uriIndex = fEmptyNamespaceURI;
            }
            else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDTRAGETNAMESPACE)) {
                uriIndex = fTargetNSURI;
            }
            else {

                try {
                    anyURIDV->validate(token
                                     , fSchemaInfo->getValidationContext()
                                     , fMemoryManager);
                }
                catch(const XMLException& excep) {
                    reportSchemaError(elem, excep);
                }
                uriIndex = fURIStringPool->addOrFind(token);
            }

            if (!namespaceList.containsElement(uriIndex)) {
                namespaceList.addElement(uriIndex);
            }
        }

        uriIndex = fEmptyNamespaceURI;
    }

    // ------------------------------------------------------------------
    // Create wildcard attribute
    // ------------------------------------------------------------------
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                            XMLUni::fgZeroLenString,
                                            uriIndex, attType, attDefType,
                                            fGrammarPoolMemoryManager);

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (namespaceList.size()) {
       attDef->setNamespaceList(&namespaceList);
    }

    return attDef;
}